

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[16],char_const*,char[7],char_const*,char[15],char[30],char_const*,char[20],unsigned_int,char[45],char_const*,char[28]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [16],char **Args_1,
          char (*Args_2) [7],char **Args_3,char (*Args_4) [15],char (*Args_5) [30],char **Args_6,
          char (*Args_7) [20],uint *Args_8,char (*Args_9) [45],char **Args_10,char (*Args_11) [28])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[16],char_const*,char[7],char_const*,char[15],char[30],char_const*,char[20],unsigned_int,char[45],char_const*,char[28]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [16])this,(char **)Args,(char (*) [7])Args_1,(char **)Args_2,
             (char (*) [15])Args_3,(char (*) [30])Args_4,(char **)Args_5,(char (*) [20])Args_6,
             (uint *)Args_7,(char (*) [45])Args_8,(char **)Args_9,(char (*) [28])Args_10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}